

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

void __thiscall Clasp::SatPreprocessor::Clause::strengthen(Clause *this,Literal p)

{
  uint uVar1;
  uint32 uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar4 = 0;
  uVar3 = 0;
  while( true ) {
    uVar5 = (ulong)uVar4;
    uVar1 = this->lits_[uVar5].rep_;
    if ((uVar1 ^ p.rep_) < 2) break;
    uVar3 = uVar3 | 1L << ((ulong)(byte)(((byte)uVar1 >> 2) - 1) & 0x3f);
    uVar4 = uVar4 + 1;
  }
  uVar4 = *(uint *)&this->field_0x8;
  uVar6 = (ulong)((uVar4 & 0x3fffffff) - 1);
  if (uVar6 < uVar5) {
    uVar6 = uVar5;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    uVar2 = this[1].lits_[uVar5 - 3].rep_;
    this->lits_[uVar5].rep_ = uVar2;
    uVar3 = uVar3 | 1L << ((ulong)(byte)(((byte)uVar2 >> 2) - 1) & 0x3f);
  }
  *(uint *)&this->field_0x8 = uVar4 & 0xc0000000 | uVar4 - 1 & 0x3fffffff;
  (this->data_).abstr = uVar3;
  return;
}

Assistant:

void SatPreprocessor::Clause::strengthen(Literal p) {
	uint64 a = 0;
	uint32 i, end;
	for (i   = 0; lits_[i] != p; ++i) { a |= Clause::abstractLit(lits_[i]); }
	for (end = size_-1; i < end; ++i) { lits_[i] = lits_[i+1]; a |= Clause::abstractLit(lits_[i]); }
	--size_;
	data_.abstr = a;
}